

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

void hd_context_free(nghttp2_hd_context *context)

{
  nghttp2_hd_context *context_local;
  
  hd_ringbuf_free(&context->hd_table,context->mem);
  return;
}

Assistant:

static void hd_context_free(nghttp2_hd_context *context) {
  hd_ringbuf_free(&context->hd_table, context->mem);
}